

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.cpp
# Opt level: O2

string * __thiscall adios2::IO::Name_abi_cxx11_(string *__return_storage_ptr__,IO *this)

{
  IO *pointer;
  allocator local_41;
  string local_40;
  
  pointer = this->m_IO;
  std::__cxx11::string::string((string *)&local_40,"in call to IO::InConfigFile",&local_41);
  helper::CheckForNullptr<adios2::core::IO>(pointer,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)(this->m_IO + 0x18));
  return __return_storage_ptr__;
}

Assistant:

std::string IO::Name() const
{
    helper::CheckForNullptr(m_IO, "in call to IO::InConfigFile");
    return m_IO->m_Name;
}